

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.h
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyz::NodeIntStateScatterAcceleration
          (ChNodeFEAxyz *this,uint off_a,ChStateDelta *a)

{
  ChVector<double> local_68;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_50 [56];
  
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_50,
             &a->super_ChVectorDynamic<double>,(ulong)off_a,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_68,local_50,(type *)0x0);
  if ((ChVector<double> *)&this->field_0x50 != &local_68) {
    *(double *)&this->field_0x50 = local_68.m_data[0];
    *(double *)&this->field_0x58 = local_68.m_data[1];
    *(double *)&this->field_0x60 = local_68.m_data[2];
  }
  return;
}

Assistant:

virtual void NodeIntStateScatterAcceleration(const unsigned int off_a, const ChStateDelta& a) override {
        SetPos_dtdt(a.segment(off_a, 3));
    }